

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unistr.cpp
# Opt level: O2

UnicodeString * __thiscall
icu_63::UnicodeString::doAppend
          (UnicodeString *this,UChar *srcChars,int32_t srcStart,int32_t srcLength)

{
  UChar *s;
  UBool UVar1;
  ushort uVar2;
  int iVar3;
  char16_t *pcVar4;
  int32_t iVar5;
  int newCapacity;
  char16_t *pcVar6;
  UnicodeString copy;
  
  if (((srcChars != (UChar *)0x0) && (srcLength != 0)) &&
     (uVar2 = (this->fUnion).fStackFields.fLengthAndFlags, (uVar2 & 0x11) == 0)) {
    s = srcChars + srcStart;
    if (srcLength < 0) {
      srcLength = u_strlen_63(s);
      if (srcLength == 0) {
        return this;
      }
      uVar2 = (this->fUnion).fStackFields.fLengthAndFlags;
    }
    if ((short)uVar2 < 0) {
      iVar5 = (this->fUnion).fFields.fLength;
    }
    else {
      iVar5 = (int)(short)uVar2 >> 5;
    }
    pcVar4 = (this->fUnion).fStackFields.fBuffer;
    pcVar6 = pcVar4;
    if ((uVar2 & 2) == 0) {
      pcVar6 = (this->fUnion).fFields.fArray;
    }
    UVar1 = isBufferWritable(this);
    if (((UVar1 == '\0') || (s + srcLength <= pcVar6)) || (pcVar6 + iVar5 <= s)) {
      newCapacity = iVar5 + srcLength;
      if ((undefined1  [56])((undefined1  [56])this->fUnion & (undefined1  [56])0x2) ==
          (undefined1  [56])0x0) {
        iVar3 = (this->fUnion).fFields.fCapacity;
      }
      else {
        iVar3 = 0x1b;
      }
      if ((iVar3 < newCapacity) || (UVar1 = isBufferWritable(this), UVar1 == '\0')) {
        iVar3 = (newCapacity >> 2) + 0x80 + newCapacity;
        if (0x7ffffff5 - newCapacity < (newCapacity >> 2) + 0x80) {
          iVar3 = 0x7ffffff5;
        }
        UVar1 = cloneArrayIfNeeded(this,newCapacity,iVar3,'\x01',(int32_t **)0x0,'\0');
        if (UVar1 == '\0') {
          return this;
        }
      }
      if ((undefined1  [56])((undefined1  [56])this->fUnion & (undefined1  [56])0x2) ==
          (undefined1  [56])0x0) {
        pcVar4 = (this->fUnion).fFields.fArray;
      }
      if ((0 < srcLength) && (s != pcVar4 + iVar5)) {
        memmove(pcVar4 + iVar5,s,(ulong)(uint)(srcLength * 2));
      }
      setLength(this,newCapacity);
    }
    else {
      UnicodeString(&copy,s,srcLength);
      if ((copy.fUnion.fStackFields.fLengthAndFlags & 1U) == 0) {
        if ((copy.fUnion.fStackFields.fLengthAndFlags & 2U) != 0) {
          copy.fUnion.fFields.fArray = copy.fUnion.fStackFields.fBuffer;
        }
        this = doAppend(this,copy.fUnion.fFields.fArray,0,srcLength);
      }
      else {
        setToBogus(this);
      }
      ~UnicodeString(&copy);
    }
  }
  return this;
}

Assistant:

UnicodeString&
UnicodeString::doAppend(const UChar *srcChars, int32_t srcStart, int32_t srcLength) {
  if(!isWritable() || srcLength == 0 || srcChars == NULL) {
    return *this;
  }

  // Perform all remaining operations relative to srcChars + srcStart.
  // From this point forward, do not use srcStart.
  srcChars += srcStart;

  if(srcLength < 0) {
    // get the srcLength if necessary
    if((srcLength = u_strlen(srcChars)) == 0) {
      return *this;
    }
  }

  int32_t oldLength = length();
  int32_t newLength = oldLength + srcLength;

  // Check for append onto ourself
  const UChar* oldArray = getArrayStart();
  if (isBufferWritable() &&
      oldArray < srcChars + srcLength &&
      srcChars < oldArray + oldLength) {
    // Copy into a new UnicodeString and start over
    UnicodeString copy(srcChars, srcLength);
    if (copy.isBogus()) {
      setToBogus();
      return *this;
    }
    return doAppend(copy.getArrayStart(), 0, srcLength);
  }

  // optimize append() onto a large-enough, owned string
  if((newLength <= getCapacity() && isBufferWritable()) ||
      cloneArrayIfNeeded(newLength, getGrowCapacity(newLength))) {
    UChar *newArray = getArrayStart();
    // Do not copy characters when
    //   UChar *buffer=str.getAppendBuffer(...);
    // is followed by
    //   str.append(buffer, length);
    // or
    //   str.appendString(buffer, length)
    // or similar.
    if(srcChars != newArray + oldLength) {
      us_arrayCopy(srcChars, 0, newArray, oldLength, srcLength);
    }
    setLength(newLength);
  }
  return *this;
}